

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O0

void wasm::
     CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>
     ::doEndCatch(Optimizer *self,Expression **currp)

{
  value_type pBVar1;
  reference this;
  reference pvVar2;
  reference ppBVar3;
  Expression **currp_local;
  Optimizer *self_local;
  
  pBVar1 = (self->
           super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>_>
           ).
           super_CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>
           .currBasicBlock;
  this = std::
         vector<std::vector<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*>_>_>_>
         ::back(&(self->
                 super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>_>
                 ).
                 super_CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>
                 .processCatchStack);
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back
                     (&(self->
                       super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>_>
                       ).
                       super_CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>
                       .catchIndexStack);
  ppBVar3 = std::
            vector<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*>_>
            ::operator[](this,(ulong)*pvVar2);
  *ppBVar3 = pBVar1;
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back
                     (&(self->
                       super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>_>
                       ).
                       super_CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>
                       .catchIndexStack);
  *pvVar2 = *pvVar2 + 1;
  return;
}

Assistant:

static void doEndCatch(SubType* self, Expression** currp) {
    // We are done with this catch; set the block that ends it
    self->processCatchStack.back()[self->catchIndexStack.back()] =
      self->currBasicBlock;
    self->catchIndexStack.back()++;
  }